

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void anon_unknown.dwarf_1236bec::createImplicitNets
               (HierarchicalInstanceSyntax *instance,ASTContext *context,NetType *netType,
               bitmask<slang::ast::InstanceFlags> flags,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames,SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  SyntaxKind SVar1;
  long lVar2;
  size_t __n;
  int iVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  SyntaxNode *expr;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this;
  char *pcVar9;
  ulong uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  value_type *elements;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNets;
  locator res;
  ASTContext ctx;
  long local_188;
  string_view local_180;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_170;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *local_168;
  ulong local_160;
  HierarchicalInstanceSyntax *local_158;
  uint64_t local_150;
  char *local_148;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_140;
  NetType *local_138;
  arrays_type *local_130;
  Compilation *local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  IdentifierNameSyntax *local_108;
  char *local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  ulong local_e0;
  char *local_d8;
  SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> local_d0 [2];
  locator local_90;
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  ASTContext local_68;
  
  if (netType->netKind != Unknown) {
    local_68.assertionInstance = context->assertionInstance;
    local_68.scope.ptr = (context->scope).ptr;
    local_68.lookupIndex = context->lookupIndex;
    local_68._12_4_ = *(undefined4 *)&context->field_0xc;
    local_68.flags.m_bits._0_1_ = (undefined1)(context->flags).m_bits;
    local_68.flags.m_bits._1_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 1);
    local_68.flags.m_bits._2_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 2);
    local_68.flags.m_bits._3_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 3);
    local_68.flags.m_bits._4_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 4);
    local_68.flags.m_bits._5_1_ = *(byte *)((long)&(context->flags).m_bits + 5);
    local_68.flags.m_bits._6_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 6);
    local_68.flags.m_bits._7_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 7);
    local_68.instanceOrProc._0_1_ = *(undefined1 *)&context->instanceOrProc;
    local_68.instanceOrProc._1_1_ = *(undefined1 *)((long)&context->instanceOrProc + 1);
    local_68.instanceOrProc._2_1_ = *(undefined1 *)((long)&context->instanceOrProc + 2);
    local_68.instanceOrProc._3_1_ = *(undefined1 *)((long)&context->instanceOrProc + 3);
    local_68.instanceOrProc._4_1_ = *(undefined1 *)((long)&context->instanceOrProc + 4);
    local_68.instanceOrProc._5_1_ = *(undefined1 *)((long)&context->instanceOrProc + 5);
    local_68.instanceOrProc._6_1_ = *(undefined1 *)((long)&context->instanceOrProc + 6);
    local_68.instanceOrProc._7_1_ = *(undefined1 *)((long)&context->instanceOrProc + 7);
    local_68.firstTempVar = context->firstTempVar;
    local_68.randomizeDetails = context->randomizeDetails;
    if ((flags.m_bits & 2) != 0) {
      local_68.flags.m_bits._5_1_ = local_68.flags.m_bits._5_1_ | 0x10;
    }
    local_160 = (instance->connections).elements._M_extent._M_extent_value + 1;
    if (1 < local_160) {
      local_160 = local_160 >> 1;
      this = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
             &(implicitNetNames->super_Storage).field_0x88;
      local_130 = (arrays_type *)&implicitNetNames->field_0x90;
      local_e0 = 0;
      local_170 = this;
      local_168 = implicitNetNames;
      local_158 = instance;
      local_140 = results;
      local_138 = netType;
      do {
        ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((local_158->connections).elements._M_ptr + local_e0 * 2));
        SVar1 = (*ppSVar4)->kind;
        if (SVar1 == OrderedPortConnection) {
          lVar6 = 0x50;
LAB_0033d431:
          expr = *(SyntaxNode **)((long)&(*ppSVar4)->kind + lVar6);
        }
        else {
          if (SVar1 == NamedPortConnection) {
            lVar6 = 0x80;
            goto LAB_0033d431;
          }
          expr = (SyntaxNode *)0x0;
        }
        if (expr != (SyntaxNode *)0x0) {
          local_d0[0].data_ = (pointer)local_d0[0].firstElement;
          local_d0[0].len = 0;
          local_d0[0].cap = 5;
          slang::ast::Expression::findPotentiallyImplicitNets(expr,&local_68,local_d0);
          if (local_d0[0].len != 0) {
            local_128 = (local_68.scope.ptr)->compilation;
            local_100 = (char *)((long)local_d0[0].data_ + local_d0[0].len * 8);
            pcVar9 = (char *)local_d0[0].data_;
            do {
              local_108 = *(IdentifierNameSyntax **)pcVar9;
              local_180 = slang::parsing::Token::valueText(&local_108->identifier);
              local_148 = pcVar9;
              local_150 = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                          operator()(this,&local_180);
              uVar8 = local_150 >> (implicitNetNames->field_0x90 & 0x3f);
              lVar2 = *(long *)&implicitNetNames->field_0xa0;
              lVar6 = (local_150 & 0xff) * 4;
              cVar13 = (&UNK_0051f39c)[lVar6];
              cVar14 = (&UNK_0051f39d)[lVar6];
              cVar15 = (&UNK_0051f39e)[lVar6];
              cVar16 = (&UNK_0051f39f)[lVar6];
              local_f0 = *(long *)&implicitNetNames->field_0xa8;
              __n = local_180._M_len;
              local_d8 = local_180._M_str;
              uVar7 = (ulong)((uint)local_150 & 7);
              local_118 = *(ulong *)&implicitNetNames->field_0x98;
              uVar10 = 0;
              cVar17 = cVar13;
              cVar18 = cVar14;
              cVar19 = cVar15;
              cVar20 = cVar16;
              cVar21 = cVar13;
              cVar22 = cVar14;
              cVar23 = cVar15;
              cVar24 = cVar16;
              cVar25 = cVar13;
              cVar26 = cVar14;
              cVar27 = cVar15;
              cVar28 = cVar16;
              local_f8 = uVar8;
              do {
                local_e8 = uVar8 * 0x10;
                pcVar9 = (char *)(lVar2 + local_e8);
                auVar12[0] = -(*pcVar9 == cVar13);
                auVar12[1] = -(pcVar9[1] == cVar14);
                auVar12[2] = -(pcVar9[2] == cVar15);
                auVar12[3] = -(pcVar9[3] == cVar16);
                auVar12[4] = -(pcVar9[4] == cVar17);
                auVar12[5] = -(pcVar9[5] == cVar18);
                auVar12[6] = -(pcVar9[6] == cVar19);
                auVar12[7] = -(pcVar9[7] == cVar20);
                auVar12[8] = -(pcVar9[8] == cVar21);
                auVar12[9] = -(pcVar9[9] == cVar22);
                auVar12[10] = -(pcVar9[10] == cVar23);
                auVar12[0xb] = -(pcVar9[0xb] == cVar24);
                auVar12[0xc] = -(pcVar9[0xc] == cVar25);
                auVar12[0xd] = -(pcVar9[0xd] == cVar26);
                auVar12[0xe] = -(pcVar9[0xe] == cVar27);
                auVar12[0xf] = -(pcVar9[0xf] == cVar28);
                uVar5 = (uint)(ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe);
                local_110 = uVar8;
                if (uVar5 != 0) {
                  lVar6 = local_f0 + uVar8 * 0xf0;
                  local_120 = uVar7;
                  local_78 = cVar13;
                  cStack_77 = cVar14;
                  cStack_76 = cVar15;
                  cStack_75 = cVar16;
                  cStack_74 = cVar17;
                  cStack_73 = cVar18;
                  cStack_72 = cVar19;
                  cStack_71 = cVar20;
                  cStack_70 = cVar21;
                  cStack_6f = cVar22;
                  cStack_6e = cVar23;
                  cStack_6d = cVar24;
                  cStack_6c = cVar25;
                  cStack_6b = cVar26;
                  cStack_6a = cVar27;
                  cStack_69 = cVar28;
                  do {
                    iVar3 = 0;
                    if (uVar5 != 0) {
                      for (; (uVar5 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
                      }
                    }
                    bVar11 = __n == *(size_t *)(lVar6 + (ulong)(uint)(iVar3 << 4));
                    local_188 = lVar6 + (ulong)(uint)(iVar3 << 4);
                    if (bVar11 && __n != 0) {
                      iVar3 = bcmp(local_d8,*(void **)(local_188 + 8),__n);
                      bVar11 = iVar3 == 0;
                      cVar13 = local_78;
                      cVar14 = cStack_77;
                      cVar15 = cStack_76;
                      cVar16 = cStack_75;
                      cVar17 = cStack_74;
                      cVar18 = cStack_73;
                      cVar19 = cStack_72;
                      cVar20 = cStack_71;
                      cVar21 = cStack_70;
                      cVar22 = cStack_6f;
                      cVar23 = cStack_6e;
                      cVar24 = cStack_6d;
                      cVar25 = cStack_6c;
                      cVar26 = cStack_6b;
                      cVar27 = cStack_6a;
                      cVar28 = cStack_69;
                    }
                    implicitNetNames = local_168;
                    this = local_170;
                    if (bVar11) goto LAB_0033d66f;
                    uVar5 = uVar5 - 1 & uVar5;
                    uVar7 = local_120;
                  } while (uVar5 != 0);
                }
                if ((*(byte *)(local_e8 + lVar2 + 0xf) &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[uVar7]) == 0) break;
                lVar6 = local_110 + uVar10;
                uVar10 = uVar10 + 1;
                uVar8 = lVar6 + 1U & local_118;
              } while (uVar10 <= local_118);
              local_188 = 0;
LAB_0033d66f:
              pcVar9 = local_148;
              if (local_188 == 0) {
                if (*(ulong *)&implicitNetNames->field_0xb8 <
                    *(ulong *)&implicitNetNames->field_0xb0) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                  ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                            (&local_90,
                             (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                              *)this,local_130,local_f8,local_150,&local_180);
                  *(long *)&implicitNetNames->field_0xb8 =
                       *(long *)&implicitNetNames->field_0xb8 + 1;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                  ::
                  unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                            (&local_90,
                             (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                              *)this,local_150,&local_180);
                }
                local_90.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                              slang::ast::NetSymbol::createImplicit(local_128,local_108,local_138);
                slang::SmallVectorBase<slang::ast::Symbol_const*>::
                emplace_back<slang::ast::Symbol_const*>
                          ((SmallVectorBase<slang::ast::Symbol_const*> *)local_140,
                           (Symbol **)&local_90);
              }
              pcVar9 = pcVar9 + 8;
            } while (pcVar9 != local_100);
          }
          if (local_d0[0].data_ != (pointer)local_d0[0].firstElement) {
            operator_delete(local_d0[0].data_);
          }
        }
        local_e0 = local_e0 + 1;
      } while (local_e0 != local_160);
    }
  }
  return;
}

Assistant:

void createImplicitNets(const HierarchicalInstanceSyntax& instance, const ASTContext& context,
                        const NetType& netType, bitmask<InstanceFlags> flags,
                        SmallSet<std::string_view, 8>& implicitNetNames,
                        SmallVectorBase<const Symbol*>& results) {
    // If no default nettype is set, we don't create implicit nets.
    if (netType.isError())
        return;

    ASTContext ctx = context;
    if (flags.has(InstanceFlags::FromBind))
        ctx.flags |= ASTFlags::BindInstantiation;

    for (auto conn : instance.connections) {
        const PropertyExprSyntax* expr = nullptr;
        switch (conn->kind) {
            case SyntaxKind::OrderedPortConnection:
                expr = conn->as<OrderedPortConnectionSyntax>().expr;
                break;
            case SyntaxKind::NamedPortConnection:
                expr = conn->as<NamedPortConnectionSyntax>().expr;
                break;
            default:
                break;
        }

        if (!expr)
            continue;

        SmallVector<const IdentifierNameSyntax*> implicitNets;
        Expression::findPotentiallyImplicitNets(*expr, ctx, implicitNets);

        auto& comp = ctx.getCompilation();
        for (auto ins : implicitNets) {
            if (implicitNetNames.emplace(ins->identifier.valueText()).second)
                results.push_back(&NetSymbol::createImplicit(comp, *ins, netType));
        }
    }
}